

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nes_controller.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33a2b9::NesControllerTest_set_get_individual_Test::
~NesControllerTest_set_get_individual_Test(NesControllerTest_set_get_individual_Test *this)

{
  NesControllerTest::~NesControllerTest(&this->super_NesControllerTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(NesControllerTest, set_get_individual) {
    controller->set(INesController::Button::A, true);
    expect_buttons_pressed(
            true, false, false, false, false, false, false, false);
    controller->set(INesController::Button::B, true);
    expect_buttons_pressed(
            true, true, false, false, false, false, false, false);
    controller->set(INesController::Button::Select, true);
    expect_buttons_pressed(true, true, true, false, false, false, false, false);
    controller->set(INesController::Button::Start, true);
    expect_buttons_pressed(true, true, true, true, false, false, false, false);
    controller->set(INesController::Button::Up, true);
    expect_buttons_pressed(true, true, true, true, true, false, false, false);
    controller->set(INesController::Button::Down, true);
    expect_buttons_pressed(true, true, true, true, true, true, false, false);
    controller->set(INesController::Button::Left, true);
    expect_buttons_pressed(true, true, true, true, true, true, true, false);
    controller->set(INesController::Button::Right, true);
    expect_buttons_pressed(true, true, true, true, true, true, true, true);
    controller->set(INesController::Button::A, false);
    expect_buttons_pressed(false, true, true, true, true, true, true, true);
    controller->set(INesController::Button::B, false);
    expect_buttons_pressed(false, false, true, true, true, true, true, true);
    controller->set(INesController::Button::Select, false);
    expect_buttons_pressed(false, false, false, true, true, true, true, true);
    controller->set(INesController::Button::Start, false);
    expect_buttons_pressed(false, false, false, false, true, true, true, true);
    controller->set(INesController::Button::Up, false);
    expect_buttons_pressed(false, false, false, false, false, true, true, true);
    controller->set(INesController::Button::Down, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, true, true);
    controller->set(INesController::Button::Left, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, false, true);
    controller->set(INesController::Button::Right, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, false, false);
}